

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::newDecisionLevel(Engine *this)

{
  uint uVar1;
  ostream *poVar2;
  string local_48;
  
  Tint::operator++(&trail_inc,0);
  if (so.debug == true) {
    std::operator<<((ostream *)&std::cerr,"Engine::newDecisionLevel\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"  trail_lim size is currently ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"  pushing ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," to trail_lim\n");
  }
  local_48._M_dataplus._M_p._0_4_ = (this->trail).sz;
  vec<int>::push(&this->trail_lim,(int *)&local_48);
  if (so.debug == true) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"trail_lim is now: ");
    showVec_abi_cxx11_(&local_48,&this->trail_lim);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_48);
  }
  SAT::newDecisionLevel(&sat);
  if (so.mip == true) {
    MIP::newDecisionLevel(mip);
  }
  uVar1 = (this->trail_lim).sz;
  if ((int)uVar1 < this->peak_depth) {
    uVar1 = this->peak_depth;
  }
  this->peak_depth = uVar1;
  return;
}

Assistant:

inline void Engine::newDecisionLevel() {
	trail_inc++;
	if (so.debug) {
		std::cerr << "Engine::newDecisionLevel\n";
		std::cerr << "  trail_lim size is currently " << trail_lim.size() << "\n";
		std::cerr << "  pushing " << trail.size() << " to trail_lim\n";
	}
	trail_lim.push(trail.size());
	if (so.debug) {
		std::cerr << "trail_lim is now: " << showVec(trail_lim) << "\n";
	}
	sat.newDecisionLevel();
	if (so.mip) {
		mip->newDecisionLevel();
	}
	assert(static_cast<int>(dec_info.size()) == decisionLevel());
	peak_depth = std::max(peak_depth, decisionLevel());
}